

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1.c
# Opt level: O0

void ptls_asn1_dump_content
               (uint8_t *bytes,size_t bytes_max,size_t byte_index,ptls_minicrypto_log_ctx_t *log_ctx
               )

{
  ulong local_38;
  size_t i;
  size_t nb_bytes;
  ptls_minicrypto_log_ctx_t *log_ctx_local;
  size_t byte_index_local;
  size_t bytes_max_local;
  uint8_t *bytes_local;
  
  if ((log_ctx != (ptls_minicrypto_log_ctx_t *)0x0) && (byte_index < bytes_max)) {
    (*log_ctx->fn)(log_ctx->ctx," ");
    for (local_38 = 0; local_38 < 0x10 && local_38 < bytes_max - byte_index; local_38 = local_38 + 1
        ) {
      (*log_ctx->fn)(log_ctx->ctx,"%02x",(ulong)bytes[byte_index + local_38]);
    }
    if (0x10 < bytes_max - byte_index) {
      (*log_ctx->fn)(log_ctx->ctx,"...");
    }
  }
  return;
}

Assistant:

void ptls_asn1_dump_content(const uint8_t *bytes, size_t bytes_max, size_t byte_index, ptls_minicrypto_log_ctx_t *log_ctx)
{
    if (log_ctx != NULL && bytes_max > byte_index) {
        size_t nb_bytes = bytes_max - byte_index;

        log_ctx->fn(log_ctx->ctx, " ");

        for (size_t i = 0; i < 16 && i < nb_bytes; i++) {
            log_ctx->fn(log_ctx->ctx, "%02x", bytes[byte_index + i]);
        }

        if (nb_bytes > 16) {
            log_ctx->fn(log_ctx->ctx, "...");
        }
    }
}